

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

ags_t AGSSock::Socket_SendDataTo(Socket *sock,SockAddr *addr,SockData *data)

{
  char *buf;
  size_t count;
  ags_t aVar1;
  SockData *data_local;
  SockAddr *addr_local;
  Socket *sock_local;
  
  buf = (char *)std::__cxx11::string::data();
  count = std::__cxx11::string::size();
  aVar1 = sendto_impl(sock,addr,buf,count);
  return aVar1;
}

Assistant:

ags_t Socket_SendDataTo(Socket *sock, const SockAddr *addr, const SockData *data)
{
	return sendto_impl(sock, addr, data->data.data(), data->data.size());
}